

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int list_find(ListNode *head,void *value,EqualityFunction equal_func,ListNode **output)

{
  int iVar1;
  ListNode *pLVar2;
  
  _assert_true((unsigned_long)head,"head",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x2ae);
  pLVar2 = head;
  do {
    pLVar2 = pLVar2->next;
    if (pLVar2 == head) {
      return 0;
    }
    iVar1 = symbol_names_match(pLVar2->value,value);
  } while (iVar1 == 0);
  *(ListNode **)equal_func = pLVar2;
  return 1;
}

Assistant:

static int list_find(ListNode * const head, const void *value,
                     const EqualityFunction equal_func, ListNode **output) {
    ListNode *current;
    assert_non_null(head);
    for (current = head->next; current != head; current = current->next) {
        if (equal_func(current->value, value)) {
            *output = current;
            return 1;
        }
    }
    return 0;
}